

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

bool __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::equals
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,
          QObject<std::complex<double>_> *other)

{
  bool bVar1;
  SquareMatrix<std::complex<double>_> SStack_28;
  SquareMatrix<std::complex<double>_> local_18;
  
  (*other->_vptr_QObject[7])(&local_18);
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&SStack_28,this);
  bVar1 = dense::SquareMatrix<std::complex<double>_>::operator==(&local_18,&SStack_28);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&SStack_28.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_18.data_);
  return bVar1;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }